

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.hpp
# Opt level: O2

void __thiscall deqp::gls::ub::StructType::~StructType(StructType *this)

{
  std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>::~vector
            (&this->m_members);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~StructType		(void) {}